

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

FeatureType * __thiscall
CoreML::Specification::FeatureDescription::mutable_type(FeatureDescription *this)

{
  FeatureType *pFVar1;
  FeatureType *_msg;
  FeatureDescription *this_local;
  
  pFVar1 = _internal_mutable_type(this);
  return pFVar1;
}

Assistant:

inline ::CoreML::Specification::FeatureType* FeatureDescription::mutable_type() {
  ::CoreML::Specification::FeatureType* _msg = _internal_mutable_type();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureDescription.type)
  return _msg;
}